

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz77.c
# Opt level: O3

void ZopfliStoreLitLenDist
               (unsigned_short length,unsigned_short dist,size_t pos,ZopfliLZ77Store *store)

{
  byte bVar1;
  uint uVar2;
  size_t *psVar3;
  unsigned_short *puVar4;
  size_t sVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  
  uVar12 = store->size;
  uVar7 = uVar12 / 9 & 0xffffffffffffffe0;
  if (uVar12 == uVar7 * 9) {
    lVar11 = 0;
    uVar9 = uVar12;
    do {
      if ((uVar9 & uVar9 - 1) == 0) {
        if (uVar9 == 0) {
          psVar3 = (size_t *)malloc(8);
        }
        else {
          psVar3 = (size_t *)realloc(store->ll_counts,lVar11 + uVar12 * 0x10);
        }
        store->ll_counts = psVar3;
      }
      else {
        psVar3 = store->ll_counts;
      }
      if (uVar12 == 0) {
        sVar5 = 0;
      }
      else {
        sVar5 = psVar3[uVar9 - 0x120];
      }
      psVar3[uVar9] = sVar5;
      uVar9 = uVar9 + 1;
      lVar11 = lVar11 + 0x10;
    } while (lVar11 != 0x1200);
  }
  if ((uVar12 & 0x1f) == 0) {
    lVar11 = 0;
    uVar9 = uVar12;
    do {
      if ((uVar9 & uVar9 - 1) == 0) {
        if (uVar9 == 0) {
          psVar3 = (size_t *)malloc(8);
        }
        else {
          psVar3 = (size_t *)realloc(store->d_counts,uVar12 * 0x10 + lVar11);
        }
        store->d_counts = psVar3;
      }
      else {
        psVar3 = store->d_counts;
      }
      if (uVar12 == 0) {
        sVar5 = 0;
      }
      else {
        sVar5 = psVar3[uVar9 - 0x20];
      }
      psVar3[uVar9] = sVar5;
      uVar9 = uVar9 + 1;
      lVar11 = lVar11 + 0x10;
    } while (lVar11 != 0x200);
  }
  uVar9 = store->size;
  if ((uVar9 & uVar9 - 1) == 0) {
    if (uVar9 == 0) {
      puVar4 = (unsigned_short *)malloc(2);
      uVar9 = 0;
    }
    else {
      puVar4 = (unsigned_short *)realloc(store->litlens,uVar9 << 2);
      uVar9 = store->size;
    }
    store->litlens = puVar4;
  }
  else {
    puVar4 = store->litlens;
  }
  puVar4[uVar9] = length;
  store->size = uVar12;
  uVar9 = uVar12 - (uVar12 >> 1 & 0x5555555555555555);
  uVar9 = (uVar9 >> 2 & 0x3333333333333333) + (uVar9 & 0x3333333333333333);
  uVar9 = ((uVar9 >> 4) + uVar9 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar9 >> 0x38 < 2) {
    if (uVar12 == 0) {
      puVar4 = (unsigned_short *)malloc(2);
      store->dists = puVar4;
      *puVar4 = dist;
      psVar3 = (size_t *)malloc(8);
      uVar6 = 0;
    }
    else {
      puVar4 = (unsigned_short *)realloc(store->dists,uVar12 * 4);
      store->dists = puVar4;
      puVar4[store->size] = dist;
      store->size = uVar12;
      psVar3 = (size_t *)realloc(store->pos,uVar12 << 4);
      uVar6 = store->size;
    }
    store->pos = psVar3;
  }
  else {
    store->dists[uVar12] = dist;
    psVar3 = store->pos;
    uVar6 = uVar12;
  }
  psVar3[uVar6] = pos;
  store->size = uVar12;
  bVar1 = (byte)(uVar9 >> 0x38);
  if (dist == 0) {
    if (bVar1 < 2) {
      if (uVar12 == 0) {
        puVar4 = (unsigned_short *)malloc(2);
        store->ll_symbol = puVar4;
        *puVar4 = length;
        puVar4 = (unsigned_short *)malloc(2);
        uVar12 = 0;
      }
      else {
        puVar4 = (unsigned_short *)realloc(store->ll_symbol,uVar12 << 2);
        store->ll_symbol = puVar4;
        puVar4[store->size] = length;
        store->size = uVar12;
        puVar4 = (unsigned_short *)realloc(store->d_symbol,uVar12 << 2);
        uVar12 = store->size;
      }
      store->d_symbol = puVar4;
    }
    else {
      store->ll_symbol[uVar12] = length;
      puVar4 = store->d_symbol;
    }
    puVar4[uVar12] = 0;
    store->size = uVar12 + 1;
    psVar3 = store->ll_counts + uVar7 * 9 + (ulong)length;
  }
  else {
    if (bVar1 < 2) {
      if (uVar12 == 0) {
        puVar4 = (unsigned_short *)malloc(2);
        sVar5 = 0;
      }
      else {
        puVar4 = (unsigned_short *)realloc(store->ll_symbol,uVar12 * 4);
        sVar5 = store->size;
      }
      store->ll_symbol = puVar4;
      iVar8 = *(int *)(ZopfliGetLengthSymbol_table + (ulong)length * 4);
      puVar4[sVar5] = (unsigned_short)iVar8;
      store->size = uVar12;
      if (uVar12 == 0) {
        puVar4 = (unsigned_short *)malloc(2);
      }
      else {
        puVar4 = (unsigned_short *)realloc(store->d_symbol,uVar12 * 4);
      }
      store->d_symbol = puVar4;
    }
    else {
      iVar8 = *(int *)(ZopfliGetLengthSymbol_table + (ulong)length * 4);
      store->ll_symbol[uVar12] = (unsigned_short)iVar8;
      store->size = uVar12;
    }
    uVar10 = dist - 1;
    uVar2 = uVar10;
    if (4 < dist) {
      uVar2 = 0x1f;
      if (uVar10 != 0) {
        for (; uVar10 >> uVar2 == 0; uVar2 = uVar2 - 1) {
        }
      }
      uVar2 = (uint)((uVar10 >> ((byte)(0x1e - (char)(uVar2 ^ 0x1f)) & 0x1f) & 1) != 0) +
              (uVar2 ^ 0x1f) * 2 ^ 0x3e;
    }
    sVar5 = store->size;
    store->d_symbol[sVar5] = (unsigned_short)uVar2;
    store->size = sVar5 + 1;
    store->ll_counts[uVar7 * 9 + (long)iVar8] = store->ll_counts[uVar7 * 9 + (long)iVar8] + 1;
    if (4 < dist) {
      uVar2 = 0x1f;
      if (uVar10 != 0) {
        for (; uVar10 >> uVar2 == 0; uVar2 = uVar2 - 1) {
        }
      }
      uVar10 = (uint)((uVar10 >> ((byte)(0x1e - (char)(uVar2 ^ 0x1f)) & 0x1f) & 1) != 0) +
               (uVar2 ^ 0x1f) * 2 ^ 0x3e;
    }
    psVar3 = store->d_counts + (uVar12 & 0xffffffffffffffe0 | (ulong)uVar10);
  }
  *psVar3 = *psVar3 + 1;
  return;
}

Assistant:

void ZopfliStoreLitLenDist(unsigned short length, unsigned short dist,
                           size_t pos, ZopfliLZ77Store* store) {
  size_t i;
  /* Needed for using ZOPFLI_APPEND_DATA multiple times. */
  size_t origsize = store->size;
  size_t llstart = ZOPFLI_NUM_LL * (origsize / ZOPFLI_NUM_LL);
  size_t dstart = ZOPFLI_NUM_D * (origsize / ZOPFLI_NUM_D);

  /* Everytime the index wraps around, a new cumulative histogram is made: we're
  keeping one histogram value per LZ77 symbol rather than a full histogram for
  each to save memory. */
  if (origsize % ZOPFLI_NUM_LL == 0) {
    size_t llsize = origsize;
    for (i = 0; i < ZOPFLI_NUM_LL; i++) {
      ZOPFLI_APPEND_DATA(
          origsize == 0 ? 0 : store->ll_counts[origsize - ZOPFLI_NUM_LL + i],
          &store->ll_counts, &llsize);
    }
  }
  if (origsize % ZOPFLI_NUM_D == 0) {
    size_t dsize = origsize;
    for (i = 0; i < ZOPFLI_NUM_D; i++) {
      ZOPFLI_APPEND_DATA(
          origsize == 0 ? 0 : store->d_counts[origsize - ZOPFLI_NUM_D + i],
          &store->d_counts, &dsize);
    }
  }

  ZOPFLI_APPEND_DATA(length, &store->litlens, &store->size);
  store->size = origsize;
  ZOPFLI_APPEND_DATA(dist, &store->dists, &store->size);
  store->size = origsize;
  ZOPFLI_APPEND_DATA(pos, &store->pos, &store->size);
  assert(length < 259);

  if (dist == 0) {
    store->size = origsize;
    ZOPFLI_APPEND_DATA(length, &store->ll_symbol, &store->size);
    store->size = origsize;
    ZOPFLI_APPEND_DATA(0, &store->d_symbol, &store->size);
    store->ll_counts[llstart + length]++;
  } else {
    store->size = origsize;
    ZOPFLI_APPEND_DATA(ZopfliGetLengthSymbol(length),
                       &store->ll_symbol, &store->size);
    store->size = origsize;
    ZOPFLI_APPEND_DATA(ZopfliGetDistSymbol(dist),
                       &store->d_symbol, &store->size);
    store->ll_counts[llstart + ZopfliGetLengthSymbol(length)]++;
    store->d_counts[dstart + ZopfliGetDistSymbol(dist)]++;
  }
}